

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiConfigurable.cpp
# Opt level: O3

unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> __thiscall
Analyser::Dynamic::MultiConfigurable::get_options(MultiConfigurable *this)

{
  undefined8 *puVar1;
  Struct *in_RAX;
  _func_int **pp_Var2;
  pointer *__ptr;
  long in_RSI;
  undefined8 *puVar3;
  _Head_base<0UL,_Reflection::Struct_*,_false> local_38;
  
  local_38._M_head_impl = in_RAX;
  pp_Var2 = (_func_int **)operator_new(0x28);
  *pp_Var2 = (_func_int *)&PTR_all_keys_abi_cxx11__0058c950;
  pp_Var2[1] = (_func_int *)(in_RSI + 8);
  pp_Var2[2] = (_func_int *)0x0;
  pp_Var2[3] = (_func_int *)0x0;
  pp_Var2[4] = (_func_int *)0x0;
  puVar3 = *(undefined8 **)(in_RSI + 8);
  puVar1 = *(undefined8 **)(in_RSI + 0x10);
  if (puVar3 != puVar1) {
    do {
      (**(code **)(*(long *)*puVar3 + 8))(&local_38);
      std::
      vector<std::unique_ptr<Reflection::Struct,std::default_delete<Reflection::Struct>>,std::allocator<std::unique_ptr<Reflection::Struct,std::default_delete<Reflection::Struct>>>>
      ::emplace_back<std::unique_ptr<Reflection::Struct,std::default_delete<Reflection::Struct>>>
                ((vector<std::unique_ptr<Reflection::Struct,std::default_delete<Reflection::Struct>>,std::allocator<std::unique_ptr<Reflection::Struct,std::default_delete<Reflection::Struct>>>>
                  *)(pp_Var2 + 2),
                 (unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> *)
                 &local_38);
      if (local_38._M_head_impl != (Struct *)0x0) {
        (*(local_38._M_head_impl)->_vptr_Struct[8])();
      }
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
  }
  (this->super_Device)._vptr_Device = pp_Var2;
  return (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Reflection::Struct> MultiConfigurable::get_options() {
	return std::make_unique<MultiStruct>(devices_);
}